

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O1

uint32_t __thiscall cfd::Psbt::AddTxIn(Psbt *this,OutPoint *outpoint,uint32_t sequence)

{
  uint uVar1;
  uint32_t uVar2;
  undefined **local_38;
  void *local_30;
  
  cfd::core::OutPoint::GetTxid();
  uVar1 = cfd::core::OutPoint::GetVout();
  uVar2 = cfd::core::Psbt::AddTxIn((Txid *)this,(uint)&local_38,uVar1);
  local_38 = &PTR__Txid_002b2f00;
  if (local_30 != (void *)0x0) {
    operator_delete(local_30);
  }
  return uVar2;
}

Assistant:

uint32_t Psbt::AddTxIn(const OutPoint& outpoint, uint32_t sequence) {
  return cfd::core::Psbt::AddTxIn(
      outpoint.GetTxid(), outpoint.GetVout(), sequence);
}